

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

size_t bitsToChunks(size_t chunkLenBits,uint8_t *input,size_t inputLen,uint16_t *chunks)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  size_t j;
  size_t sVar5;
  
  if ((chunkLenBits != 0) && (chunkLenBits <= inputLen << 3)) {
    uVar1 = (inputLen << 3) / chunkLenBits;
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
      chunks[uVar2] = 0;
      iVar4 = 0;
      for (sVar5 = 0; chunkLenBits != sVar5; sVar5 = sVar5 + 1) {
        iVar4 = iVar4 + ((input[lVar3 + sVar5 >> 3] >> (~(byte)(lVar3 + sVar5) & 7) & 1) <<
                        ((uint)sVar5 & 0x1f));
        chunks[uVar2] = (uint16_t)iVar4;
      }
      lVar3 = lVar3 + chunkLenBits;
    }
    return uVar1;
  }
  return 0;
}

Assistant:

static size_t bitsToChunks(size_t chunkLenBits, const uint8_t* input, size_t inputLen,
                           uint16_t* chunks) {
  if (!chunkLenBits || chunkLenBits > inputLen * 8) {
    assert(!"Invalid input to bitsToChunks: not enough input");
    return 0;
  }
  size_t chunkCount = ((inputLen * 8) / chunkLenBits);

  for (size_t i = 0; i < chunkCount; i++) {
    chunks[i] = 0;
    for (size_t j = 0; j < chunkLenBits; j++) {
      chunks[i] += getBit(input, i * chunkLenBits + j) << j;
      assert(chunks[i] < (1 << chunkLenBits));
    }
  }

  return chunkCount;
}